

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O3

int VP8LEncodeImage(WebPConfig *config,WebPPicture *picture)

{
  int iVar1;
  WebPAuxStats *pWVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  WebPEncodingError error;
  WebPAuxStats *stats;
  int percent;
  VP8LBitWriter bw;
  size_t coded_size;
  int local_70;
  int local_6c;
  VP8LBitWriter local_68;
  int local_38 [2];
  
  local_70 = 0;
  if (picture == (WebPPicture *)0x0) {
    return 0;
  }
  if ((config == (WebPConfig *)0x0) || (picture->argb == (uint32_t *)0x0)) {
    iVar6 = WebPEncodingSetError(picture,VP8_ENC_ERROR_NULL_PARAMETER);
    return iVar6;
  }
  iVar6 = picture->width;
  iVar1 = picture->height;
  iVar4 = VP8LBitWriterInit(&local_68,
                            (long)(iVar1 * iVar6 << (config->image_hint != WEBP_HINT_GRAPH)));
  if (iVar4 == 0) {
LAB_0013bbab:
    error = VP8_ENC_ERROR_OUT_OF_MEMORY;
  }
  else {
    iVar4 = WebPReportProgress(picture,1,&local_70);
    if (iVar4 != 0) {
      pWVar2 = picture->stats;
      local_6c = iVar6;
      if (pWVar2 != (WebPAuxStats *)0x0) {
        memset(pWVar2,0,0xbc);
        pWVar2->PSNR[0] = 99.0;
        pWVar2->PSNR[1] = 99.0;
        pWVar2->PSNR[2] = 99.0;
        pWVar2->PSNR[3] = 99.0;
        pWVar2->PSNR[4] = 99.0;
      }
      iVar6 = picture->width;
      iVar4 = picture->height;
      if (0x1f < local_68.used_) {
        VP8LPutBitsFlushBits(&local_68);
      }
      local_68.bits_ = (ulong)(iVar6 - 1) << ((byte)local_68.used_ & 0x3f) | local_68.bits_;
      iVar6 = local_68.used_ + 0xe;
      bVar3 = 0x11 < local_68.used_;
      local_68.used_ = iVar6;
      if (bVar3) {
        VP8LPutBitsFlushBits(&local_68);
      }
      local_68.bits_ = (ulong)(iVar4 - 1) << ((byte)local_68.used_ & 0x3f) | local_68.bits_;
      local_68.used_ = local_68.used_ + 0xe;
      if (local_68.error_ == 0) {
        uVar5 = WebPPictureHasTransparency(picture);
        if (0x1f < local_68.used_) {
          VP8LPutBitsFlushBits(&local_68);
        }
        local_68.bits_ = local_68.bits_ | (ulong)uVar5 << ((byte)local_68.used_ & 0x3f);
        iVar6 = local_68.used_ + 1;
        bVar3 = 0x1e < local_68.used_;
        local_68.used_ = iVar6;
        if (bVar3) {
          VP8LPutBitsFlushBits(&local_68);
        }
        local_68.used_ = local_68.used_ + 3;
        if (local_68.error_ == 0) {
          iVar4 = WebPReportProgress(picture,2,&local_70);
          iVar6 = local_6c;
          if (iVar4 != 0) {
            iVar4 = VP8LEncodeStream(config,picture,&local_68);
            if (iVar4 == 0) goto LAB_0013bc9e;
            iVar4 = WebPReportProgress(picture,99,&local_70);
            if (iVar4 != 0) {
              iVar4 = WriteImage(picture,&local_68,(size_t *)local_38);
              if (iVar4 == 0) goto LAB_0013bc9e;
              iVar4 = WebPReportProgress(picture,100,&local_70);
              if (iVar4 != 0) {
                pWVar2 = picture->stats;
                if (pWVar2 != (WebPAuxStats *)0x0) {
                  pWVar2->coded_size = pWVar2->coded_size + local_38[0];
                  pWVar2->lossless_size = local_38[0];
                }
                if (picture->extra_info != (uint8_t *)0x0) {
                  memset(picture->extra_info,0,(long)((iVar1 + 0xf >> 4) * (iVar6 + 0xf >> 4)));
                }
                goto LAB_0013bc9e;
              }
            }
          }
          goto LAB_0013bc91;
        }
      }
      goto LAB_0013bbab;
    }
LAB_0013bc91:
    error = VP8_ENC_ERROR_USER_ABORT;
  }
  WebPEncodingSetError(picture,error);
LAB_0013bc9e:
  if (local_68.error_ != 0) {
    WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  VP8LBitWriterWipeOut(&local_68);
  return (uint)(picture->error_code == VP8_ENC_OK);
}

Assistant:

int VP8LEncodeImage(const WebPConfig* const config,
                    const WebPPicture* const picture) {
  int width, height;
  int has_alpha;
  size_t coded_size;
  int percent = 0;
  int initial_size;
  VP8LBitWriter bw;

  if (picture == NULL) return 0;

  if (config == NULL || picture->argb == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_NULL_PARAMETER);
  }

  width = picture->width;
  height = picture->height;
  // Initialize BitWriter with size corresponding to 16 bpp to photo images and
  // 8 bpp for graphical images.
  initial_size = (config->image_hint == WEBP_HINT_GRAPH) ?
      width * height : width * height * 2;
  if (!VP8LBitWriterInit(&bw, initial_size)) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  if (!WebPReportProgress(picture, 1, &percent)) {
 UserAbort:
    WebPEncodingSetError(picture, VP8_ENC_ERROR_USER_ABORT);
    goto Error;
  }
  // Reset stats (for pure lossless coding)
  if (picture->stats != NULL) {
    WebPAuxStats* const stats = picture->stats;
    memset(stats, 0, sizeof(*stats));
    stats->PSNR[0] = 99.f;
    stats->PSNR[1] = 99.f;
    stats->PSNR[2] = 99.f;
    stats->PSNR[3] = 99.f;
    stats->PSNR[4] = 99.f;
  }

  // Write image size.
  if (!WriteImageSize(picture, &bw)) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  has_alpha = WebPPictureHasTransparency(picture);
  // Write the non-trivial Alpha flag and lossless version.
  if (!WriteRealAlphaAndVersion(&bw, has_alpha)) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  if (!WebPReportProgress(picture, 2, &percent)) goto UserAbort;

  // Encode main image stream.
  if (!VP8LEncodeStream(config, picture, &bw)) goto Error;

  if (!WebPReportProgress(picture, 99, &percent)) goto UserAbort;

  // Finish the RIFF chunk.
  if (!WriteImage(picture, &bw, &coded_size)) goto Error;

  if (!WebPReportProgress(picture, 100, &percent)) goto UserAbort;

#if !defined(WEBP_DISABLE_STATS)
  // Save size.
  if (picture->stats != NULL) {
    picture->stats->coded_size += (int)coded_size;
    picture->stats->lossless_size = (int)coded_size;
  }
#endif

  if (picture->extra_info != NULL) {
    const int mb_w = (width + 15) >> 4;
    const int mb_h = (height + 15) >> 4;
    memset(picture->extra_info, 0, mb_w * mb_h * sizeof(*picture->extra_info));
  }

 Error:
  if (bw.error_) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  VP8LBitWriterWipeOut(&bw);
  return (picture->error_code == VP8_ENC_OK);
}